

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O3

void randomx::initCache(randomx_cache *cache,void *key,size_t keySize)

{
  SuperscalarProgram *prog;
  pointer puVar1;
  iterator __position;
  uint uVar2;
  int i;
  long lVar3;
  uint uVar4;
  uint64_t rcp;
  Blake2Generator gen;
  uint64_t local_138;
  argon2_instance_t local_130;
  Blake2Generator local_f0;
  argon2_context local_a8;
  
  local_a8.out = (uint8_t *)0x0;
  local_a8.outlen = 0;
  local_a8.pwdlen = (uint32_t)keySize;
  local_a8.salt = "RandomX\x03";
  local_a8.saltlen = 8;
  local_a8.secret = (uint8_t *)0x0;
  local_a8.secretlen = 0;
  local_a8.ad = (uint8_t *)0x0;
  local_a8.adlen = 0;
  local_a8.t_cost = 3;
  local_a8.m_cost = 0x40000;
  local_a8.lanes = 1;
  local_a8.threads = 1;
  local_a8.version = 0x13;
  local_a8.allocate_cbk = (allocate_fptr)0x0;
  local_a8.free_cbk = (deallocate_fptr)0x0;
  local_a8.flags = 0;
  local_a8.pwd = (uint8_t *)key;
  randomx_argon2_validate_inputs(&local_a8);
  local_130.segment_length = local_a8.m_cost / (local_a8.lanes * 4);
  local_130.version = local_a8.version;
  local_130.passes = local_a8.t_cost;
  local_130.memory_blocks = local_a8.m_cost;
  local_130.lane_length = local_130.segment_length << 2;
  local_130.lanes = local_a8.lanes;
  local_130.threads = local_a8.threads;
  local_130.type = Argon2_d;
  local_130.memory = (block *)cache->memory;
  local_130.impl = cache->argonImpl;
  if (local_a8.lanes < local_a8.threads) {
    local_130.threads = local_a8.lanes;
  }
  randomx_argon2_initialize(&local_130,&local_a8);
  randomx_argon2_fill_memory_blocks(&local_130);
  puVar1 = (cache->reciprocalCache).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((cache->reciprocalCache).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (cache->reciprocalCache).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  lVar3 = 0;
  Blake2Generator::Blake2Generator(&local_f0,key,keySize,0);
  do {
    prog = cache->programs + lVar3;
    generateSuperscalar(prog,&local_f0);
    uVar2 = cache->programs[lVar3].size;
    if (uVar2 != 0) {
      uVar4 = 0;
      do {
        if (prog->programBuffer[(int)uVar4].opcode == '\r') {
          local_138 = randomx_reciprocal((ulong)prog->programBuffer[(int)uVar4].imm32);
          prog->programBuffer[(int)uVar4].imm32 =
               (uint32_t)
               ((ulong)((long)(cache->reciprocalCache).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(cache->reciprocalCache).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
          __position._M_current =
               (cache->reciprocalCache).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (cache->reciprocalCache).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                       &cache->reciprocalCache,__position,&local_138);
          }
          else {
            *__position._M_current = local_138;
            (cache->reciprocalCache).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          uVar2 = prog->size;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar2);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  return;
}

Assistant:

void initCache(randomx_cache* cache, const void* key, size_t keySize) {
		uint32_t memory_blocks, segment_length;
		argon2_instance_t instance;
		argon2_context context;

		context.out = nullptr;
		context.outlen = 0;
		context.pwd = CONST_CAST(uint8_t *)key;
		context.pwdlen = (uint32_t)keySize;
		context.salt = CONST_CAST(uint8_t *)RANDOMX_ARGON_SALT;
		context.saltlen = (uint32_t)randomx::ArgonSaltSize;
		context.secret = NULL;
		context.secretlen = 0;
		context.ad = NULL;
		context.adlen = 0;
		context.t_cost = RANDOMX_ARGON_ITERATIONS;
		context.m_cost = RANDOMX_ARGON_MEMORY;
		context.lanes = RANDOMX_ARGON_LANES;
		context.threads = 1;
		context.allocate_cbk = NULL;
		context.free_cbk = NULL;
		context.flags = ARGON2_DEFAULT_FLAGS;
		context.version = ARGON2_VERSION_NUMBER;

		int inputsValid = randomx_argon2_validate_inputs(&context);
		assert(inputsValid == ARGON2_OK);

		/* 2. Align memory size */
		/* Minimum memory_blocks = 8L blocks, where L is the number of lanes */
		memory_blocks = context.m_cost;

		segment_length = memory_blocks / (context.lanes * ARGON2_SYNC_POINTS);

		instance.version = context.version;
		instance.memory = NULL;
		instance.passes = context.t_cost;
		instance.memory_blocks = memory_blocks;
		instance.segment_length = segment_length;
		instance.lane_length = segment_length * ARGON2_SYNC_POINTS;
		instance.lanes = context.lanes;
		instance.threads = context.threads;
		instance.type = Argon2_d;
		instance.memory = (block*)cache->memory;
		instance.impl = cache->argonImpl;

		if (instance.threads > instance.lanes) {
			instance.threads = instance.lanes;
		}

		/* 3. Initialization: Hashing inputs, allocating memory, filling first
		 * blocks
		 */
		randomx_argon2_initialize(&instance, &context);

		randomx_argon2_fill_memory_blocks(&instance);

		cache->reciprocalCache.clear();
		randomx::Blake2Generator gen(key, keySize);
		for (int i = 0; i < RANDOMX_CACHE_ACCESSES; ++i) {
			randomx::generateSuperscalar(cache->programs[i], gen);
			for (unsigned j = 0; j < cache->programs[i].getSize(); ++j) {
				auto& instr = cache->programs[i](j);
				if ((SuperscalarInstructionType)instr.opcode == SuperscalarInstructionType::IMUL_RCP) {
					auto rcp = randomx_reciprocal(instr.getImm32());
					instr.setImm32(cache->reciprocalCache.size());
					cache->reciprocalCache.push_back(rcp);
				}
			}
		}
	}